

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::rescalePartials
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *scaleFactors,
          float *cumulativeScaleFactors,int fillWithOnes)

{
  float *pfVar1;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int k;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar13;
  bool bVar14;
  float fVar15;
  double dVar16;
  undefined1 auVar17 [16];
  float fVar18;
  long lVar10;
  long lVar11;
  long lVar12;
  
  lVar2 = (this->super_BeagleCPUImpl<float,_1,_0>).kFlags;
  lVar7 = 0;
  iVar13 = 0;
  do {
    if ((this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount <= lVar7) {
      return;
    }
    uVar5 = (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
    auVar17 = ZEXT816(0) << 0x40;
    iVar4 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount * 4;
    uVar5 = ~((int)uVar5 >> 0x1f) & uVar5;
    iVar8 = iVar13;
    uVar6 = uVar5;
    while (bVar14 = uVar6 != 0, uVar6 = uVar6 - 1, bVar14) {
      lVar9 = (long)iVar8;
      lVar10 = (long)iVar8;
      lVar11 = (long)iVar8;
      lVar12 = (long)iVar8;
      iVar8 = iVar8 + iVar4;
      auVar17 = vmaxss_avx(ZEXT416((uint)destP[lVar9]),auVar17);
      auVar17 = vmaxss_avx(ZEXT416((uint)destP[lVar10 + 1]),auVar17);
      auVar17 = vmaxss_avx(ZEXT416((uint)destP[lVar11 + 2]),auVar17);
      auVar17 = vmaxss_avx(ZEXT416((uint)destP[lVar12 + 3]),auVar17);
    }
    uVar3 = vcmpss_avx512f(auVar17,ZEXT416(0),0);
    bVar14 = (bool)((byte)uVar3 & 1);
    fVar15 = (float)((uint)bVar14 * 0x3f800000 + (uint)!bVar14 * auVar17._0_4_);
    fVar18 = 1.0 / fVar15;
    iVar8 = iVar13;
    while (bVar14 = uVar5 != 0, uVar5 = uVar5 - 1, bVar14) {
      pfVar1 = destP + iVar8;
      auVar17._0_4_ = fVar18 * *pfVar1;
      auVar17._4_4_ = fVar18 * pfVar1[1];
      auVar17._8_4_ = fVar18 * pfVar1[2];
      auVar17._12_4_ = fVar18 * pfVar1[3];
      *(undefined1 (*) [16])(destP + iVar8) = auVar17;
      iVar8 = iVar8 + iVar4;
    }
    if (((uint)lVar2 >> 10 & 1) == 0) {
      scaleFactors[lVar7] = fVar15;
      if (cumulativeScaleFactors != (float *)0x0) {
        dVar16 = log((double)fVar15);
        fVar15 = (float)(dVar16 + (double)cumulativeScaleFactors[lVar7]);
LAB_001438ea:
        cumulativeScaleFactors[lVar7] = fVar15;
      }
    }
    else {
      dVar16 = log((double)fVar15);
      scaleFactors[lVar7] = (float)dVar16;
      if (cumulativeScaleFactors != (float *)0x0) {
        fVar15 = (float)dVar16 + cumulativeScaleFactors[lVar7];
        goto LAB_001438ea;
      }
    }
    lVar7 = lVar7 + 1;
    iVar13 = iVar13 + 4;
  } while( true );
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::rescalePartials(REALTYPE* destP,
		REALTYPE* scaleFactors,
		REALTYPE* cumulativeScaleFactors,
        const int  fillWithOnes) {

	bool useLogScalars = kFlags & BEAGLE_FLAG_SCALERS_LOG;

    for (int k = 0; k < kPatternCount; k++) {
    	REALTYPE max = 0;
        const int patternOffset = k * 4;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;

#ifdef BEAGLE_TEST_OPTIMIZATION
            REALTYPE max01 = FAST_MAX(destP[offset + 0], destP[offset + 1]);
            REALTYPE max23 = FAST_MAX(destP[offset + 2], destP[offset + 3]);
            max = FAST_MAX(max, max01);
            max = FAST_MAX(max, max23);
#else
			#pragma unroll
            for (int i = 0; i < 4; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
#endif
        }

        if (max == 0)
            max = REALTYPE(1.0);

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;
			#pragma unroll
            for (int i = 0; i < 4; i++)
                destP[offset++] *= oneOverMax;
        }

        if (useLogScalars) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}